

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

_Bool fxp_fstat_recv(sftp_packet *pktin,sftp_request *req,fxp_attrs *attrs)

{
  _Bool _Var1;
  
  safefree(req);
  if (pktin->type == 0x69) {
    _Var1 = fxp_got_attrs(pktin,attrs);
    return _Var1;
  }
  fxp_got_status(pktin);
  sftp_pkt_free(pktin);
  return false;
}

Assistant:

bool fxp_fstat_recv(struct sftp_packet *pktin, struct sftp_request *req,
                    struct fxp_attrs *attrs)
{
    sfree(req);
    if (pktin->type == SSH_FXP_ATTRS) {
        return fxp_got_attrs(pktin, attrs);
    } else {
        fxp_got_status(pktin);
        sftp_pkt_free(pktin);
        return false;
    }
}